

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed)

{
  uint in_ESI;
  long in_RDI;
  uint i;
  uint32 jsr;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = (in_ESI >> 0x18 | (in_ESI & 0xff0000) >> 8 | (in_ESI & 0xff00) << 8 | in_ESI << 0x18) ^
             0xaac29377;
  local_14 = in_ESI;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    local_18 = local_18 << 0x11 ^ local_18;
    local_18 = local_18 >> 0xd ^ local_18;
    local_18 = local_18 << 5 ^ local_18;
    local_14 = bitmix32c(local_14);
    *(uint *)(in_RDI + (ulong)local_1c * 4) = local_14 ^ local_18;
  }
  *(undefined4 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed) {
  uint32 jsr = utils::swap32(seed) ^ 0xAAC29377;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed = bitmix32c(seed);

    m_state[i] = seed ^ jsr;
  }
  m_index = 0;
}